

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t1cod.c
# Opt level: O3

void jpc_initluts(void)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [12];
  bool bVar3;
  int_fast16_t *piVar4;
  uint_least8_t *puVar5;
  int iVar6;
  long lVar7;
  int_fast16_t iVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  bool bVar14;
  float fVar15;
  float fVar22;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar24;
  float fVar25;
  float fVar32;
  undefined1 auVar26 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  uint uVar33;
  uint uVar38;
  uint uVar40;
  undefined1 auVar34 [16];
  int iVar39;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar41;
  int iVar48;
  int iVar49;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  int iVar50;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar51;
  int iVar62;
  int iVar63;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int iVar64;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  int iVar65;
  int iVar69;
  int iVar70;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  int iVar71;
  undefined1 auVar68 [16];
  uint uVar72;
  int iVar73;
  uint uVar76;
  uint uVar78;
  uint uVar80;
  undefined1 auVar74 [16];
  int iVar77;
  int iVar79;
  int iVar81;
  undefined1 auVar75 [16];
  uint uVar82;
  uint uVar85;
  uint uVar86;
  uint uVar87;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  uint_least8_t uVar105;
  uint_least8_t uVar109;
  uint_least8_t uVar110;
  uint uVar106;
  uint_least8_t uVar111;
  uint_least8_t uVar112;
  uint_least8_t uVar114;
  uint_least8_t uVar115;
  uint uVar113;
  uint_least8_t uVar116;
  uint_least8_t uVar117;
  uint_least8_t uVar119;
  uint_least8_t uVar120;
  uint uVar118;
  uint_least8_t uVar121;
  uint_least8_t uVar122;
  uint_least8_t uVar124;
  uint_least8_t uVar125;
  uint uVar123;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  uint_least8_t uVar126;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  long lVar23;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  
  piVar4 = &jpc_mqctxs[0].ind;
  iVar6 = 0;
  do {
    ((jpc_mqctx_t *)(piVar4 + -1))->mps = false;
    if (iVar6 == 0) {
      iVar8 = 3;
    }
    else {
      iVar8 = 4;
      if (iVar6 != 1) {
        if (iVar6 == 0x12) {
          *piVar4 = 0x2e;
          break;
        }
        iVar8 = 0;
      }
    }
    *piVar4 = iVar8;
    iVar6 = iVar6 + 1;
    piVar4 = piVar4 + 2;
  } while (iVar6 != 0x13);
  puVar5 = jpc_zcctxnolut;
  lVar7 = 0;
  do {
    uVar10 = 0;
    do {
      uVar33 = (uint)uVar10;
      iVar12 = ((uint)(uVar10 >> 7) & 0x1ffffff) + (uint)((uVar33 >> 5 & 1) != 0);
      iVar6 = ((uint)(uVar10 >> 4) & 1) + (uint)((uVar33 >> 6 & 1) != 0);
      uVar13 = (uVar33 & 1) + (uint)((uVar33 >> 3 & 1) != 0);
      iVar11 = ((uint)(uVar10 >> 1) & 1) + uVar13 + (uint)((uVar33 >> 2 & 1) != 0);
      uVar33 = (uint)lVar7;
      iVar39 = iVar12;
      if (uVar33 < 2) {
LAB_00127580:
        if (iVar39 == 1) {
          uVar13 = 8;
          if (iVar6 == 0) {
            uVar13 = (uint)(iVar11 == 0 ^ 7);
          }
        }
        else {
          uVar13 = 9;
          if (iVar39 == 0) {
            if (iVar6 == 1) {
              uVar13 = 4;
            }
            else if (iVar6 == 0) {
LAB_001275ee:
              uVar13 = (uint)(iVar11 == 1 ^ 3);
              if (iVar11 == 0) {
                uVar13 = 1;
              }
            }
            else {
              uVar13 = 5;
            }
          }
        }
      }
      else if (uVar33 == 3) {
        iVar12 = iVar12 + iVar6;
        if (iVar11 == 2) {
          uVar13 = (uint)(byte)(8 - (iVar12 == 0));
        }
        else if (iVar11 == 1) {
          uVar13 = (uint)(byte)(6 - (iVar12 == 1));
          if (iVar12 == 0) {
            uVar13 = 4;
          }
        }
        else {
          uVar13 = 9;
          bVar14 = iVar11 == 0;
          iVar11 = iVar12;
          if (bVar14) goto LAB_001275ee;
        }
      }
      else {
        iVar39 = iVar6;
        iVar6 = iVar12;
        if (uVar33 == 2) goto LAB_00127580;
      }
      puVar5[uVar10] = (uint_least8_t)uVar13;
      uVar10 = uVar10 + 1;
    } while (uVar10 != 0x100);
    lVar7 = lVar7 + 1;
    puVar5 = puVar5 + 0x100;
    if (lVar7 == 4) {
      iVar51 = 0xc;
      iVar62 = 0xd;
      iVar63 = 0xe;
      iVar64 = 0xf;
      iVar6 = 8;
      iVar11 = 9;
      iVar39 = 10;
      iVar12 = 0xb;
      iVar65 = 4;
      iVar69 = 5;
      iVar70 = 6;
      iVar71 = 7;
      iVar73 = 0;
      iVar77 = 1;
      iVar79 = 2;
      iVar81 = 3;
      lVar7 = 0;
      do {
        uVar106 = iVar51 << 4;
        uVar113 = iVar62 << 4;
        uVar118 = iVar63 << 4;
        uVar123 = iVar64 << 4;
        uVar33 = iVar6 << 4;
        uVar13 = iVar11 << 4;
        uVar38 = iVar39 << 4;
        uVar40 = iVar12 << 4;
        uVar72 = iVar65 << 4;
        uVar76 = iVar69 << 4;
        uVar78 = iVar70 << 4;
        uVar80 = iVar71 << 4;
        uVar82 = iVar73 << 4;
        uVar85 = iVar77 << 4;
        uVar86 = iVar79 << 4;
        uVar87 = iVar81 << 4;
        local_88 = CONCAT44(uVar85,uVar82) & 0x22000000220;
        uStack_80 = CONCAT44(uVar87,uVar86) & 0x22000000220;
        auVar101._0_4_ = -(uint)((uVar106 & 0x220) == 0x20);
        auVar101._4_4_ = -(uint)((uVar113 & 0x220) == 0x20);
        auVar101._8_4_ = -(uint)((uVar118 & 0x220) == 0x20);
        auVar101._12_4_ = -(uint)((uVar123 & 0x220) == 0x20);
        auVar130._0_4_ = -(uint)((uVar33 & 0x220) == 0x20);
        auVar130._4_4_ = -(uint)((uVar13 & 0x220) == 0x20);
        auVar130._8_4_ = -(uint)((uVar38 & 0x220) == 0x20);
        auVar130._12_4_ = -(uint)((uVar40 & 0x220) == 0x20);
        auVar66._0_4_ = -(uint)((uVar72 & 0x220) == 0x20);
        auVar66._4_4_ = -(uint)((uVar76 & 0x220) == 0x20);
        auVar66._8_4_ = -(uint)((uVar78 & 0x220) == 0x20);
        auVar66._12_4_ = -(uint)((uVar80 & 0x220) == 0x20);
        auVar93._0_4_ = -(uint)((uVar82 & 0x220) == 0x20);
        auVar93._4_4_ = -(uint)((uVar85 & 0x220) == 0x20);
        auVar93._8_4_ = -(uint)((uVar86 & 0x220) == 0x20);
        auVar93._12_4_ = -(uint)((uVar87 & 0x220) == 0x20);
        auVar43._0_4_ = -(uint)((uVar106 & 0x880) == 0x80);
        auVar43._4_4_ = -(uint)((uVar113 & 0x880) == 0x80);
        auVar43._8_4_ = -(uint)((uVar118 & 0x880) == 0x80);
        auVar43._12_4_ = -(uint)((uVar123 & 0x880) == 0x80);
        auVar138._0_4_ = -(uint)((uVar33 & 0x880) == 0x80);
        auVar138._4_4_ = -(uint)((uVar13 & 0x880) == 0x80);
        auVar138._8_4_ = -(uint)((uVar38 & 0x880) == 0x80);
        auVar138._12_4_ = -(uint)((uVar40 & 0x880) == 0x80);
        auVar139 = packssdw(auVar138 | auVar130,auVar43 | auVar101);
        auVar133._0_4_ = -(uint)((uVar72 & 0x880) == 0x80);
        auVar133._4_4_ = -(uint)((uVar76 & 0x880) == 0x80);
        auVar133._8_4_ = -(uint)((uVar78 & 0x880) == 0x80);
        auVar133._12_4_ = -(uint)((uVar80 & 0x880) == 0x80);
        auVar131._0_4_ = -(uint)((uVar82 & 0x880) == 0x80);
        auVar131._4_4_ = -(uint)((uVar85 & 0x880) == 0x80);
        auVar131._8_4_ = -(uint)((uVar86 & 0x880) == 0x80);
        auVar131._12_4_ = -(uint)((uVar87 & 0x880) == 0x80);
        auVar132 = packssdw(auVar131 | auVar93,auVar133 | auVar66);
        auVar133 = packsswb(auVar132,auVar139);
        auVar88._0_4_ = -(uint)((uVar106 & 0x220) == 0x220);
        auVar88._4_4_ = -(uint)((uVar113 & 0x220) == 0x220);
        auVar88._8_4_ = -(uint)((uVar118 & 0x220) == 0x220);
        auVar88._12_4_ = -(uint)((uVar123 & 0x220) == 0x220);
        auVar132._0_4_ = -(uint)((uVar33 & 0x220) == 0x220);
        auVar132._4_4_ = -(uint)((uVar13 & 0x220) == 0x220);
        auVar132._8_4_ = -(uint)((uVar38 & 0x220) == 0x220);
        auVar132._12_4_ = -(uint)((uVar40 & 0x220) == 0x220);
        auVar127._0_4_ = -(uint)((uVar72 & 0x220) == 0x220);
        auVar127._4_4_ = -(uint)((uVar76 & 0x220) == 0x220);
        auVar127._8_4_ = -(uint)((uVar78 & 0x220) == 0x220);
        auVar127._12_4_ = -(uint)((uVar80 & 0x220) == 0x220);
        auVar141._0_4_ = -(uint)((int)local_88 == 0x220);
        auVar141._4_4_ = -(uint)(local_88._4_4_ == 0x220);
        auVar141._8_4_ = -(uint)((int)uStack_80 == 0x220);
        auVar141._12_4_ = -(uint)(uStack_80._4_4_ == 0x220);
        auVar52._0_4_ = -(uint)((uVar106 & 0x880) == 0x880);
        auVar52._4_4_ = -(uint)((uVar113 & 0x880) == 0x880);
        auVar52._8_4_ = -(uint)((uVar118 & 0x880) == 0x880);
        auVar52._12_4_ = -(uint)((uVar123 & 0x880) == 0x880);
        auVar149._0_4_ = -(uint)((uVar33 & 0x880) == 0x880);
        auVar149._4_4_ = -(uint)((uVar13 & 0x880) == 0x880);
        auVar149._8_4_ = -(uint)((uVar38 & 0x880) == 0x880);
        auVar149._12_4_ = -(uint)((uVar40 & 0x880) == 0x880);
        auVar139 = packssdw(auVar149 | auVar132,auVar52 | auVar88);
        auVar102._0_4_ = -(uint)((uVar72 & 0x880) == 0x880);
        auVar102._4_4_ = -(uint)((uVar76 & 0x880) == 0x880);
        auVar102._8_4_ = -(uint)((uVar78 & 0x880) == 0x880);
        auVar102._12_4_ = -(uint)((uVar80 & 0x880) == 0x880);
        auVar42._0_4_ = -(uint)((uVar82 & 0x880) == 0x880);
        auVar42._4_4_ = -(uint)((uVar85 & 0x880) == 0x880);
        auVar42._8_4_ = -(uint)((uVar86 & 0x880) == 0x880);
        auVar42._12_4_ = -(uint)((uVar87 & 0x880) == 0x880);
        auVar132 = packssdw(auVar42 | auVar141,auVar102 | auVar127);
        auVar43 = packsswb(auVar132,auVar139);
        auVar53._0_4_ = -(uint)((uVar106 & 0x110) == 0x10);
        auVar53._4_4_ = -(uint)((uVar113 & 0x110) == 0x10);
        auVar53._8_4_ = -(uint)((uVar118 & 0x110) == 0x10);
        auVar53._12_4_ = -(uint)((uVar123 & 0x110) == 0x10);
        auVar94._0_4_ = -(uint)((uVar33 & 0x110) == 0x10);
        auVar94._4_4_ = -(uint)((uVar13 & 0x110) == 0x10);
        auVar94._8_4_ = -(uint)((uVar38 & 0x110) == 0x10);
        auVar94._12_4_ = -(uint)((uVar40 & 0x110) == 0x10);
        auVar103._0_4_ = -(uint)((uVar72 & 0x110) == 0x10);
        auVar103._4_4_ = -(uint)((uVar76 & 0x110) == 0x10);
        auVar103._8_4_ = -(uint)((uVar78 & 0x110) == 0x10);
        auVar103._12_4_ = -(uint)((uVar80 & 0x110) == 0x10);
        auVar128._0_4_ = -(uint)((uVar106 & 0x440) == 0x40);
        auVar128._4_4_ = -(uint)((uVar113 & 0x440) == 0x40);
        auVar128._8_4_ = -(uint)((uVar118 & 0x440) == 0x40);
        auVar128._12_4_ = -(uint)((uVar123 & 0x440) == 0x40);
        auVar54._0_4_ = -(uint)((uVar33 & 0x440) == 0x40);
        auVar54._4_4_ = -(uint)((uVar13 & 0x440) == 0x40);
        auVar54._8_4_ = -(uint)((uVar38 & 0x440) == 0x40);
        auVar54._12_4_ = -(uint)((uVar40 & 0x440) == 0x40);
        auVar95._0_4_ = -(uint)((uVar82 & 0x110) == 0x10);
        auVar95._4_4_ = -(uint)((uVar85 & 0x110) == 0x10);
        auVar95._8_4_ = -(uint)((uVar86 & 0x110) == 0x10);
        auVar95._12_4_ = -(uint)((uVar87 & 0x110) == 0x10);
        auVar132 = packssdw(auVar54 | auVar94,auVar128 | auVar53);
        auVar129._0_4_ = -(uint)((uVar72 & 0x440) == 0x40);
        auVar129._4_4_ = -(uint)((uVar76 & 0x440) == 0x40);
        auVar129._8_4_ = -(uint)((uVar78 & 0x440) == 0x40);
        auVar129._12_4_ = -(uint)((uVar80 & 0x440) == 0x40);
        auVar140._0_4_ = -(uint)((uVar82 & 0x440) == 0x40);
        auVar140._4_4_ = -(uint)((uVar85 & 0x440) == 0x40);
        auVar140._8_4_ = -(uint)((uVar86 & 0x440) == 0x40);
        auVar140._12_4_ = -(uint)((uVar87 & 0x440) == 0x40);
        auVar139 = packssdw(auVar140 | auVar95,auVar129 | auVar103);
        auVar141 = packsswb(auVar139,auVar132);
        auVar89._0_4_ = -(uint)((uVar106 & 0x110) == 0x110);
        auVar89._4_4_ = -(uint)((uVar113 & 0x110) == 0x110);
        auVar89._8_4_ = -(uint)((uVar118 & 0x110) == 0x110);
        auVar89._12_4_ = -(uint)((uVar123 & 0x110) == 0x110);
        auVar107._0_4_ = -(uint)((uVar106 & 0x440) == 0x440);
        auVar107._4_4_ = -(uint)((uVar113 & 0x440) == 0x440);
        auVar107._8_4_ = -(uint)((uVar118 & 0x440) == 0x440);
        auVar107._12_4_ = -(uint)((uVar123 & 0x440) == 0x440);
        auVar145._0_4_ = -(uint)((uVar33 & 0x110) == 0x110);
        auVar145._4_4_ = -(uint)((uVar13 & 0x110) == 0x110);
        auVar145._8_4_ = -(uint)((uVar38 & 0x110) == 0x110);
        auVar145._12_4_ = -(uint)((uVar40 & 0x110) == 0x110);
        auVar34._0_4_ = -(uint)((uVar33 & 0x440) == 0x440);
        auVar34._4_4_ = -(uint)((uVar13 & 0x440) == 0x440);
        auVar34._8_4_ = -(uint)((uVar38 & 0x440) == 0x440);
        auVar34._12_4_ = -(uint)((uVar40 & 0x440) == 0x440);
        auVar132 = packssdw(auVar34 | auVar145,auVar107 | auVar89);
        auVar67._0_4_ = -(uint)((uVar72 & 0x110) == 0x110);
        auVar67._4_4_ = -(uint)((uVar76 & 0x110) == 0x110);
        auVar67._8_4_ = -(uint)((uVar78 & 0x110) == 0x110);
        auVar67._12_4_ = -(uint)((uVar80 & 0x110) == 0x110);
        auVar74._0_4_ = -(uint)((uVar72 & 0x440) == 0x440);
        auVar74._4_4_ = -(uint)((uVar76 & 0x440) == 0x440);
        auVar74._8_4_ = -(uint)((uVar78 & 0x440) == 0x440);
        auVar74._12_4_ = -(uint)((uVar80 & 0x440) == 0x440);
        auVar139._0_4_ = -(uint)((uVar82 & 0x110) == 0x110);
        auVar139._4_4_ = -(uint)((uVar85 & 0x110) == 0x110);
        auVar139._8_4_ = -(uint)((uVar86 & 0x110) == 0x110);
        auVar139._12_4_ = -(uint)((uVar87 & 0x110) == 0x110);
        auVar83._0_4_ = -(uint)((uVar82 & 0x440) == 0x440);
        auVar83._4_4_ = -(uint)((uVar85 & 0x440) == 0x440);
        auVar83._8_4_ = -(uint)((uVar86 & 0x440) == 0x440);
        auVar83._12_4_ = -(uint)((uVar87 & 0x440) == 0x440);
        auVar139 = packssdw(auVar83 | auVar139,auVar74 | auVar67);
        auVar132 = packsswb(auVar139,auVar132);
        auVar90._8_4_ = 0xffffffff;
        auVar90._0_8_ = 0xffffffffffffffff;
        auVar90._12_4_ = 0xffffffff;
        *(undefined1 (*) [16])(jpc_spblut + lVar7) =
             (auVar133 ^ auVar90 | auVar43) & (auVar132 ^ auVar141 | auVar43 ^ auVar133) &
             (auVar141 ^ auVar90 | auVar132 | auVar43 ^ auVar133) & _DAT_0013de10;
        lVar7 = lVar7 + 0x10;
        iVar73 = iVar73 + 0x10;
        iVar77 = iVar77 + 0x10;
        iVar79 = iVar79 + 0x10;
        iVar81 = iVar81 + 0x10;
        iVar65 = iVar65 + 0x10;
        iVar69 = iVar69 + 0x10;
        iVar70 = iVar70 + 0x10;
        iVar71 = iVar71 + 0x10;
        iVar6 = iVar6 + 0x10;
        iVar11 = iVar11 + 0x10;
        iVar39 = iVar39 + 0x10;
        iVar12 = iVar12 + 0x10;
        iVar51 = iVar51 + 0x10;
        iVar62 = iVar62 + 0x10;
        iVar63 = iVar63 + 0x10;
        iVar64 = iVar64 + 0x10;
      } while (lVar7 != 0x100);
      iVar51 = 4;
      iVar62 = 5;
      iVar63 = 6;
      iVar64 = 7;
      iVar6 = 0;
      iVar11 = 1;
      iVar39 = 2;
      iVar12 = 3;
      lVar7 = 0;
      do {
        uVar33 = iVar51 << 4;
        uVar13 = iVar62 << 4;
        uVar38 = iVar63 << 4;
        uVar40 = iVar64 << 4;
        uVar72 = iVar6 << 4;
        uVar76 = iVar11 << 4;
        uVar78 = iVar39 << 4;
        uVar80 = iVar12 << 4;
        iVar81 = (int)-(uint)((uVar33 & 0x880) == 0x80 || (uVar33 & 0x220) == 0x20) >> 0x1f;
        iVar71 = (int)-(uint)((uVar13 & 0x880) == 0x80 || (uVar13 & 0x220) == 0x20) >> 0x1f;
        iVar65 = (int)-(uint)((uVar38 & 0x880) == 0x80 || (uVar38 & 0x220) == 0x20) >> 0x1f;
        iVar73 = (int)-(uint)((uVar40 & 0x880) == 0x80 || (uVar40 & 0x220) == 0x20) >> 0x1f;
        iVar77 = (int)-(uint)((uVar72 & 0x880) == 0x80 || (uVar72 & 0x220) == 0x20) >> 0x1f;
        iVar79 = (int)-(uint)((uVar76 & 0x880) == 0x80 || (uVar76 & 0x220) == 0x20) >> 0x1f;
        iVar69 = (int)-(uint)((uVar78 & 0x880) == 0x80 || (uVar78 & 0x220) == 0x20) >> 0x1f;
        iVar70 = (int)-(uint)((uVar80 & 0x880) == 0x80 || (uVar80 & 0x220) == 0x20) >> 0x1f;
        auVar55._0_4_ = -(uint)((uVar33 & 0x220) == 0x220);
        auVar55._4_4_ = -(uint)((uVar13 & 0x220) == 0x220);
        auVar55._8_4_ = -(uint)((uVar38 & 0x220) == 0x220);
        auVar55._12_4_ = -(uint)((uVar40 & 0x220) == 0x220);
        auVar35._0_4_ = -(uint)((uVar72 & 0x220) == 0x220);
        auVar35._4_4_ = -(uint)((uVar76 & 0x220) == 0x220);
        auVar35._8_4_ = -(uint)((uVar78 & 0x220) == 0x220);
        auVar35._12_4_ = -(uint)((uVar80 & 0x220) == 0x220);
        auVar44._0_4_ = -(uint)((uVar33 & 0x880) == 0x880);
        auVar44._4_4_ = -(uint)((uVar13 & 0x880) == 0x880);
        auVar44._8_4_ = -(uint)((uVar38 & 0x880) == 0x880);
        auVar44._12_4_ = -(uint)((uVar40 & 0x880) == 0x880);
        auVar44 = auVar44 | auVar55;
        auVar26._0_4_ = -(uint)((uVar72 & 0x880) == 0x880);
        auVar26._4_4_ = -(uint)((uVar76 & 0x880) == 0x880);
        auVar26._8_4_ = -(uint)((uVar78 & 0x880) == 0x880);
        auVar26._12_4_ = -(uint)((uVar80 & 0x880) == 0x880);
        auVar132 = packssdw(auVar26 | auVar35,auVar44);
        auVar29._0_12_ = auVar132._0_12_;
        auVar29._12_2_ = auVar132._6_2_;
        auVar29._14_2_ = auVar132._6_2_;
        auVar28._12_4_ = auVar29._12_4_;
        auVar28._0_10_ = auVar132._0_10_;
        auVar28._10_2_ = auVar132._4_2_;
        auVar27._10_6_ = auVar28._10_6_;
        auVar27._0_8_ = auVar132._0_8_;
        auVar27._8_2_ = auVar132._4_2_;
        auVar1._4_8_ = auVar27._8_8_;
        auVar1._2_2_ = auVar132._2_2_;
        auVar1._0_2_ = auVar132._2_2_;
        iVar24 = CONCAT22(auVar132._0_2_,auVar132._0_2_);
        iVar41 = (auVar44._0_4_ << 0x1f) >> 0x1f;
        iVar48 = (auVar44._4_4_ << 0x1f) >> 0x1f;
        iVar49 = (auVar44._8_4_ << 0x1f) >> 0x1f;
        iVar50 = (auVar44._12_4_ << 0x1f) >> 0x1f;
        auVar56._0_4_ = -(uint)((uVar33 & 0x110) == 0x110);
        auVar56._4_4_ = -(uint)((uVar13 & 0x110) == 0x110);
        auVar56._8_4_ = -(uint)((uVar38 & 0x110) == 0x110);
        auVar56._12_4_ = -(uint)((uVar40 & 0x110) == 0x110);
        auVar91._0_4_ = -(uint)((uVar33 & 0x440) == 0x440);
        auVar91._4_4_ = -(uint)((uVar13 & 0x440) == 0x440);
        auVar91._8_4_ = -(uint)((uVar38 & 0x440) == 0x440);
        auVar91._12_4_ = -(uint)((uVar40 & 0x440) == 0x440);
        auVar91 = auVar91 | auVar56;
        auVar18._0_4_ = -(uint)((uVar72 & 0x110) == 0x110);
        auVar18._4_4_ = -(uint)((uVar76 & 0x110) == 0x110);
        auVar18._8_4_ = -(uint)((uVar78 & 0x110) == 0x110);
        auVar18._12_4_ = -(uint)((uVar80 & 0x110) == 0x110);
        auVar96._0_4_ = -(uint)((uVar72 & 0x440) == 0x440);
        auVar96._4_4_ = -(uint)((uVar76 & 0x440) == 0x440);
        auVar96._8_4_ = -(uint)((uVar78 & 0x440) == 0x440);
        auVar96._12_4_ = -(uint)((uVar80 & 0x440) == 0x440);
        auVar132 = packssdw(auVar96 | auVar18,auVar91);
        auVar99._0_12_ = auVar132._0_12_;
        auVar99._12_2_ = auVar132._6_2_;
        auVar99._14_2_ = auVar132._6_2_;
        auVar98._12_4_ = auVar99._12_4_;
        auVar98._0_10_ = auVar132._0_10_;
        auVar98._10_2_ = auVar132._4_2_;
        auVar97._10_6_ = auVar98._10_6_;
        auVar97._0_8_ = auVar132._0_8_;
        auVar97._8_2_ = auVar132._4_2_;
        auVar2._4_8_ = auVar97._8_8_;
        auVar2._2_2_ = auVar132._2_2_;
        auVar2._0_2_ = auVar132._2_2_;
        uVar106 = CONCAT22(auVar132._0_2_,auVar132._0_2_) -
                  ((int)-(uint)((uVar72 & 0x440) == 0x40 || (uVar72 & 0x110) == 0x10) >> 0x1f);
        uVar113 = auVar2._0_4_ -
                  ((int)-(uint)((uVar76 & 0x440) == 0x40 || (uVar76 & 0x110) == 0x10) >> 0x1f);
        uVar118 = auVar97._8_4_ -
                  ((int)-(uint)((uVar78 & 0x440) == 0x40 || (uVar78 & 0x110) == 0x10) >> 0x1f);
        uVar123 = auVar98._12_4_ -
                  ((int)-(uint)((uVar80 & 0x440) == 0x40 || (uVar80 & 0x110) == 0x10) >> 0x1f);
        uVar82 = ((auVar91._0_4_ << 0x1f) >> 0x1f) -
                 ((int)-(uint)((uVar33 & 0x440) == 0x40 || (uVar33 & 0x110) == 0x10) >> 0x1f);
        uVar85 = ((auVar91._4_4_ << 0x1f) >> 0x1f) -
                 ((int)-(uint)((uVar13 & 0x440) == 0x40 || (uVar13 & 0x110) == 0x10) >> 0x1f);
        uVar86 = ((auVar91._8_4_ << 0x1f) >> 0x1f) -
                 ((int)-(uint)((uVar38 & 0x440) == 0x40 || (uVar38 & 0x110) == 0x10) >> 0x1f);
        uVar87 = ((auVar91._12_4_ << 0x1f) >> 0x1f) -
                 ((int)-(uint)((uVar40 & 0x440) == 0x40 || (uVar40 & 0x110) == 0x10) >> 0x1f);
        uVar33 = (uint)(iVar41 - iVar81 < 0);
        uVar38 = (uint)(iVar48 - iVar71 < 0);
        uVar72 = (uint)(iVar49 - iVar65 < 0);
        uVar78 = (uint)(iVar50 - iVar73 < 0);
        auVar45._0_4_ = -(uint)(iVar41 == iVar81);
        auVar45._4_4_ = -(uint)(iVar48 == iVar71);
        auVar45._8_4_ = -(uint)(iVar49 == iVar65);
        auVar45._12_4_ = -(uint)(iVar50 == iVar73);
        uVar13 = (uint)(iVar24 - iVar77 < 0);
        uVar40 = (uint)(auVar1._0_4_ - iVar79 < 0);
        uVar76 = (uint)(auVar27._8_4_ - iVar69 < 0);
        uVar80 = (uint)(auVar28._12_4_ - iVar70 < 0);
        auVar30._0_4_ = -(uint)(iVar24 == iVar77);
        auVar30._4_4_ = -(uint)(auVar1._0_4_ == iVar79);
        auVar30._8_4_ = -(uint)(auVar27._8_4_ == iVar69);
        auVar30._12_4_ = -(uint)(auVar28._12_4_ == iVar70);
        auVar139 = packssdw(auVar30,auVar45);
        iVar65 = (uVar106 ^ -uVar13) + uVar13;
        iVar69 = (uVar113 ^ -uVar40) + uVar40;
        iVar70 = (uVar118 ^ -uVar76) + uVar76;
        iVar71 = (uVar123 ^ -uVar80) + uVar80;
        iVar73 = (uVar82 ^ -uVar33) + uVar33;
        iVar77 = (uVar85 ^ -uVar38) + uVar38;
        iVar79 = (uVar86 ^ -uVar72) + uVar72;
        iVar81 = (uVar87 ^ -uVar78) + uVar78;
        auVar36._0_4_ = -(uint)(iVar73 == 0);
        auVar36._4_4_ = -(uint)(iVar77 == 0);
        auVar36._8_4_ = -(uint)(iVar79 == 0);
        auVar36._12_4_ = -(uint)(iVar81 == 0);
        auVar57._0_4_ = -(uint)(iVar65 == 0);
        auVar57._4_4_ = -(uint)(iVar69 == 0);
        auVar57._8_4_ = -(uint)(iVar70 == 0);
        auVar57._12_4_ = -(uint)(iVar71 == 0);
        auVar132 = packssdw(auVar57,auVar36);
        auVar43 = packsswb(auVar132,auVar132);
        auVar46._0_4_ = -(uint)(iVar73 == -1);
        auVar46._4_4_ = -(uint)(iVar77 == -1);
        auVar46._8_4_ = -(uint)(iVar79 == -1);
        auVar46._12_4_ = -(uint)(iVar81 == -1);
        auVar19._0_4_ = -(uint)(iVar65 == -1);
        auVar19._4_4_ = -(uint)(iVar69 == -1);
        auVar19._8_4_ = -(uint)(iVar70 == -1);
        auVar19._12_4_ = -(uint)(iVar71 == -1);
        auVar132 = packssdw(auVar19,auVar46);
        auVar132 = packsswb(auVar132,auVar132);
        auVar92._0_4_ = -(uint)(uVar82 == 0);
        auVar92._4_4_ = -(uint)(uVar85 == 0);
        auVar92._8_4_ = -(uint)(uVar86 == 0);
        auVar92._12_4_ = -(uint)(uVar87 == 0);
        auVar100._0_4_ = -(uint)(uVar106 == 0);
        auVar100._4_4_ = -(uint)(uVar113 == 0);
        auVar100._8_4_ = -(uint)(uVar118 == 0);
        auVar100._12_4_ = -(uint)(uVar123 == 0);
        auVar133 = packssdw(auVar100,auVar92);
        auVar139 = packsswb(auVar139,auVar139);
        auVar133 = packsswb(auVar133,auVar133);
        *(ulong *)(jpc_scctxnolut + lVar7) =
             ~auVar139._0_8_ &
             (auVar132._0_8_ & (ulong)DAT_0013de30 |
             ~auVar132._0_8_ &
             CONCAT17(auVar43[7] + '\x11',
                      CONCAT16(auVar43[6] + '\x11',
                               CONCAT15(auVar43[5] + '\x11',
                                        CONCAT14(auVar43[4] + '\x11',
                                                 CONCAT13(auVar43[3] + '\x11',
                                                          CONCAT12(auVar43[2] + '\x11',
                                                                   CONCAT11(auVar43[1] + '\x11',
                                                                            auVar43[0] + '\x11')))))
                              ))) |
             CONCAT17(auVar133[7] + '\x0e',
                      CONCAT16(auVar133[6] + '\x0e',
                               CONCAT15(auVar133[5] + '\x0e',
                                        CONCAT14(auVar133[4] + '\x0e',
                                                 CONCAT13(auVar133[3] + '\x0e',
                                                          CONCAT12(auVar133[2] + '\x0e',
                                                                   CONCAT11(auVar133[1] + '\x0e',
                                                                            auVar133[0] + '\x0e'))))
                                       ))) & auVar139._0_8_;
        auVar132 = _DAT_0013dec0;
        lVar7 = lVar7 + 8;
        iVar6 = iVar6 + 8;
        iVar11 = iVar11 + 8;
        iVar39 = iVar39 + 8;
        iVar12 = iVar12 + 8;
        iVar51 = iVar51 + 8;
        iVar62 = iVar62 + 8;
        iVar63 = iVar63 + 8;
        iVar64 = iVar64 + 8;
      } while (lVar7 != 0x100);
      lVar7 = 0;
      bVar14 = true;
      do {
        bVar3 = bVar14;
        lVar9 = 0;
        auVar20 = _DAT_0013de60;
        auVar31 = _DAT_0013de70;
        auVar37 = _DAT_0013de80;
        auVar47 = _DAT_0013de90;
        auVar75 = _DAT_00139d70;
        auVar84 = _DAT_0013dea0;
        auVar104 = _DAT_0013c1d0;
        auVar150 = _DAT_0013deb0;
        do {
          if (bVar3) {
            auVar43 = auVar20 & auVar132;
            auVar139 = auVar84 & auVar132;
            auVar141 = auVar104 & auVar132;
            auVar133 = auVar75 & auVar132;
            auVar134._0_4_ = -(uint)(auVar133._0_4_ == 0);
            auVar134._4_4_ = -(uint)(auVar133._4_4_ == 0);
            auVar134._8_4_ = -(uint)(auVar133._8_4_ == 0);
            auVar134._12_4_ = -(uint)(auVar133._12_4_ == 0);
            auVar108._4_4_ = auVar134._0_4_;
            auVar108._0_4_ = auVar134._4_4_;
            auVar108._8_4_ = auVar134._12_4_;
            auVar108._12_4_ = auVar134._8_4_;
            auVar142._0_4_ = -(uint)(auVar141._0_4_ == 0);
            auVar142._4_4_ = -(uint)(auVar141._4_4_ == 0);
            auVar142._8_4_ = -(uint)(auVar141._8_4_ == 0);
            auVar142._12_4_ = -(uint)(auVar141._12_4_ == 0);
            auVar135._4_4_ = auVar142._0_4_;
            auVar135._0_4_ = auVar142._4_4_;
            auVar135._8_4_ = auVar142._12_4_;
            auVar135._12_4_ = auVar142._8_4_;
            auVar141 = auVar150 & auVar132;
            auVar133 = packssdw(auVar108 & auVar134,auVar135 & auVar142);
            auVar143._0_4_ = -(uint)(auVar141._0_4_ == 0);
            auVar143._4_4_ = -(uint)(auVar141._4_4_ == 0);
            auVar143._8_4_ = -(uint)(auVar141._8_4_ == 0);
            auVar143._12_4_ = -(uint)(auVar141._12_4_ == 0);
            auVar136._4_4_ = auVar143._0_4_;
            auVar136._0_4_ = auVar143._4_4_;
            auVar136._8_4_ = auVar143._12_4_;
            auVar136._12_4_ = auVar143._8_4_;
            auVar58._0_4_ = -(uint)(auVar139._0_4_ == 0);
            auVar58._4_4_ = -(uint)(auVar139._4_4_ == 0);
            auVar58._8_4_ = -(uint)(auVar139._8_4_ == 0);
            auVar58._12_4_ = -(uint)(auVar139._12_4_ == 0);
            auVar144._4_4_ = auVar58._0_4_;
            auVar144._0_4_ = auVar58._4_4_;
            auVar144._8_4_ = auVar58._12_4_;
            auVar144._12_4_ = auVar58._8_4_;
            auVar139 = auVar37 & auVar132;
            auVar141 = packssdw(auVar136 & auVar143,auVar144 & auVar58);
            auVar145 = auVar47 & auVar132;
            auVar133 = packssdw(auVar133,auVar141);
            auVar146._0_4_ = -(uint)(auVar145._0_4_ == 0);
            auVar146._4_4_ = -(uint)(auVar145._4_4_ == 0);
            auVar146._8_4_ = -(uint)(auVar145._8_4_ == 0);
            auVar146._12_4_ = -(uint)(auVar145._12_4_ == 0);
            auVar137._4_4_ = auVar146._0_4_;
            auVar137._0_4_ = auVar146._4_4_;
            auVar137._8_4_ = auVar146._12_4_;
            auVar137._12_4_ = auVar146._8_4_;
            auVar59._0_4_ = -(uint)(auVar139._0_4_ == 0);
            auVar59._4_4_ = -(uint)(auVar139._4_4_ == 0);
            auVar59._8_4_ = -(uint)(auVar139._8_4_ == 0);
            auVar59._12_4_ = -(uint)(auVar139._12_4_ == 0);
            auVar147._4_4_ = auVar59._0_4_;
            auVar147._0_4_ = auVar59._4_4_;
            auVar147._8_4_ = auVar59._12_4_;
            auVar147._12_4_ = auVar59._8_4_;
            auVar139 = auVar31 & auVar132;
            auVar141 = packssdw(auVar137 & auVar146,auVar147 & auVar59);
            auVar60._0_4_ = -(uint)(auVar139._0_4_ == 0);
            auVar60._4_4_ = -(uint)(auVar139._4_4_ == 0);
            auVar60._8_4_ = -(uint)(auVar139._8_4_ == 0);
            auVar60._12_4_ = -(uint)(auVar139._12_4_ == 0);
            auVar148._4_4_ = auVar60._0_4_;
            auVar148._0_4_ = auVar60._4_4_;
            auVar148._8_4_ = auVar60._12_4_;
            auVar148._12_4_ = auVar60._8_4_;
            auVar68._0_4_ = -(uint)(auVar43._0_4_ == 0);
            auVar68._4_4_ = -(uint)(auVar43._4_4_ == 0);
            auVar68._8_4_ = -(uint)(auVar43._8_4_ == 0);
            auVar68._12_4_ = -(uint)(auVar43._12_4_ == 0);
            auVar61._4_4_ = auVar68._0_4_;
            auVar61._0_4_ = auVar68._4_4_;
            auVar61._8_4_ = auVar68._12_4_;
            auVar61._12_4_ = auVar68._8_4_;
            auVar139 = packssdw(auVar148 & auVar60,auVar61 & auVar68);
            auVar139 = packssdw(auVar141,auVar139);
            auVar139 = packsswb(auVar133,auVar139);
            uVar105 = auVar139[0] + '\v';
            uVar109 = auVar139[1] + '\v';
            uVar110 = auVar139[2] + '\v';
            uVar111 = auVar139[3] + '\v';
            uVar112 = auVar139[4] + '\v';
            uVar114 = auVar139[5] + '\v';
            uVar115 = auVar139[6] + '\v';
            uVar116 = auVar139[7] + '\v';
            uVar117 = auVar139[8] + '\v';
            uVar119 = auVar139[9] + '\v';
            uVar120 = auVar139[10] + '\v';
            uVar121 = auVar139[0xb] + '\v';
            uVar122 = auVar139[0xc] + '\v';
            uVar124 = auVar139[0xd] + '\v';
            uVar125 = auVar139[0xe] + '\v';
            uVar126 = auVar139[0xf] + '\v';
          }
          else {
            uVar105 = '\f';
            uVar109 = '\f';
            uVar110 = '\f';
            uVar111 = '\f';
            uVar112 = '\f';
            uVar114 = '\f';
            uVar115 = '\f';
            uVar116 = '\f';
            uVar117 = '\f';
            uVar119 = '\f';
            uVar120 = '\f';
            uVar121 = '\f';
            uVar122 = '\f';
            uVar124 = '\f';
            uVar125 = '\f';
            uVar126 = '\f';
          }
          puVar5 = jpc_magctxnolut + lVar9 + lVar7;
          *puVar5 = uVar105;
          puVar5[1] = uVar109;
          puVar5[2] = uVar110;
          puVar5[3] = uVar111;
          puVar5[4] = uVar112;
          puVar5[5] = uVar114;
          puVar5[6] = uVar115;
          puVar5[7] = uVar116;
          puVar5[8] = uVar117;
          puVar5[9] = uVar119;
          puVar5[10] = uVar120;
          puVar5[0xb] = uVar121;
          puVar5[0xc] = uVar122;
          puVar5[0xd] = uVar124;
          puVar5[0xe] = uVar125;
          puVar5[0xf] = uVar126;
          lVar9 = lVar9 + 0x10;
          lVar23 = auVar75._8_8_;
          auVar75._0_8_ = auVar75._0_8_ + 0x10;
          auVar75._8_8_ = lVar23 + 0x10;
          lVar23 = auVar104._8_8_;
          auVar104._0_8_ = auVar104._0_8_ + 0x10;
          auVar104._8_8_ = lVar23 + 0x10;
          lVar23 = auVar150._8_8_;
          auVar150._0_8_ = auVar150._0_8_ + 0x10;
          auVar150._8_8_ = lVar23 + 0x10;
          lVar23 = auVar84._8_8_;
          auVar84._0_8_ = auVar84._0_8_ + 0x10;
          auVar84._8_8_ = lVar23 + 0x10;
          lVar23 = auVar47._8_8_;
          auVar47._0_8_ = auVar47._0_8_ + 0x10;
          auVar47._8_8_ = lVar23 + 0x10;
          lVar23 = auVar37._8_8_;
          auVar37._0_8_ = auVar37._0_8_ + 0x10;
          auVar37._8_8_ = lVar23 + 0x10;
          lVar23 = auVar31._8_8_;
          auVar31._0_8_ = auVar31._0_8_ + 0x10;
          auVar31._8_8_ = lVar23 + 0x10;
          lVar23 = auVar20._8_8_;
          auVar20._0_8_ = auVar20._0_8_ + 0x10;
          auVar20._8_8_ = lVar23 + 0x10;
        } while (lVar9 != 0x800);
        lVar7 = 0x800;
        bVar14 = false;
      } while (bVar3);
      uVar33 = 0;
      iVar6 = 1;
      local_78 = 0;
      uStack_70 = 1;
      lVar7 = 0;
      do {
        auVar21._4_4_ = 0;
        auVar21._0_4_ = uVar33;
        auVar21._8_4_ = iVar6;
        auVar21._12_4_ = 0;
        fVar25 = (float)((SUB168(auVar21 | _DAT_00138090,0) - (double)DAT_00138090) * 0.015625);
        fVar32 = (float)((SUB168(auVar21 | _DAT_00138090,8) - DAT_00138090._8_8_) * 0.015625);
        fVar15 = fVar25 + -1.5;
        fVar22 = fVar32 + -1.5;
        dVar16 = floor((double)(fVar25 * fVar25 - fVar15 * fVar15) * 64.0 + 0.5);
        dVar17 = floor((double)(fVar32 * fVar32 - fVar22 * fVar22) * 64.0 + 0.5);
        jpc_signmsedec[lVar7] = (long)(dVar16 * 0.015625 * 8192.0);
        jpc_signmsedec[lVar7 + 1] = (long)(dVar17 * 0.015625 * 8192.0);
        dVar16 = floor((double)(fVar25 * fVar25) * 64.0 + 0.5);
        dVar17 = floor((double)(fVar32 * fVar32) * 64.0 + 0.5);
        jpc_signmsedec0[lVar7] = (long)(dVar16 * 0.015625 * 8192.0);
        jpc_signmsedec0[lVar7 + 1] = (long)(dVar17 * 0.015625 * 8192.0);
        uVar13 = -(uint)(local_78._4_4_ == 0 && (int)((uint)local_78 ^ 0x80000000) < -0x7fffffc0);
        uVar38 = -(uint)(uStack_70._4_4_ == 0 && (int)((uint)uStack_70 ^ 0x80000000) < -0x7fffffc0);
        fVar15 = (float)(~uVar13 & (uint)fVar15 | (uint)(fVar25 + -0.5) & uVar13);
        fVar22 = (float)(~uVar38 & (uint)fVar22 | (uint)(fVar32 + -0.5) & uVar38);
        fVar25 = (fVar25 + -1.0) * (fVar25 + -1.0);
        fVar32 = (fVar32 + -1.0) * (fVar32 + -1.0);
        dVar16 = floor((double)(fVar25 - fVar15 * fVar15) * 64.0 + 0.5);
        dVar17 = floor((double)(fVar32 - fVar22 * fVar22) * 64.0 + 0.5);
        jpc_refnmsedec[lVar7] = (long)(dVar16 * 0.015625 * 8192.0);
        jpc_refnmsedec[lVar7 + 1] = (long)(dVar17 * 0.015625 * 8192.0);
        dVar16 = floor((double)fVar25 * 64.0 + 0.5);
        dVar17 = floor((double)fVar32 * 64.0 + 0.5);
        jpc_refnmsedec0[lVar7] = (long)(dVar16 * 0.015625 * 8192.0);
        jpc_refnmsedec0[lVar7 + 1] = (long)(dVar17 * 0.015625 * 8192.0);
        lVar7 = lVar7 + 2;
        local_78 = local_78 + 2;
        uStack_70 = uStack_70 + 2;
        uVar33 = uVar33 + 2;
        iVar6 = iVar6 + 2;
      } while (lVar7 != 0x80);
      return;
    }
  } while( true );
}

Assistant:

void jpc_initluts()
{
	int i;
	int orient;
	int refine;
	float u;
	float v;
	float t;

/* XXX - hack */
jpc_initmqctxs();

	for (orient = 0; orient < 4; ++orient) {
		for (i = 0; i < 256; ++i) {
			jpc_zcctxnolut[(orient << 8) | i] = jpc_getzcctxno(i, orient);
		}
	}

	for (i = 0; i < 256; ++i) {
		jpc_spblut[i] = jpc_getspb(i << 4);
	}

	for (i = 0; i < 256; ++i) {
		jpc_scctxnolut[i] = jpc_getscctxno(i << 4);
	}

	for (refine = 0; refine < 2; ++refine) {
		for (i = 0; i < 2048; ++i) {
			jpc_magctxnolut[(refine << 11) + i] = jpc_getmagctxno((refine ? JPC_REFINE : 0) | i);
		}
	}

	for (i = 0; i < (1 << JPC_NMSEDEC_BITS); ++i) {
		t = i * jpc_pow2i(-JPC_NMSEDEC_FRACBITS);
		u = t;
		v = t - 1.5;
		jpc_signmsedec[i] = jpc_dbltofix(floor((u * u - v * v) * jpc_pow2i(JPC_NMSEDEC_FRACBITS) + 0.5) / jpc_pow2i(JPC_NMSEDEC_FRACBITS));
/* XXX - this calc is not correct */
		jpc_signmsedec0[i] = jpc_dbltofix(floor((u * u) * jpc_pow2i(JPC_NMSEDEC_FRACBITS) + 0.5) / jpc_pow2i(JPC_NMSEDEC_FRACBITS));
		u = t - 1.0;
		if (i & (1 << (JPC_NMSEDEC_BITS - 1))) {
			v = t - 1.5;
		} else {
			v = t - 0.5;
		}
		jpc_refnmsedec[i] = jpc_dbltofix(floor((u * u - v * v) * jpc_pow2i(JPC_NMSEDEC_FRACBITS) + 0.5) / jpc_pow2i(JPC_NMSEDEC_FRACBITS));
/* XXX - this calc is not correct */
		jpc_refnmsedec0[i] = jpc_dbltofix(floor((u * u) * jpc_pow2i(JPC_NMSEDEC_FRACBITS) + 0.5) / jpc_pow2i(JPC_NMSEDEC_FRACBITS));
	}
}